

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

void __thiscall MIDIStreamer::Precache(MIDIStreamer *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DWORD (*paDVar3) [384];
  uint uVar4;
  ulong uVar5;
  int j;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  unsigned_short *puVar9;
  uint uVar10;
  uint uVar11;
  int i;
  ulong uVar12;
  TArray<unsigned_short,_unsigned_short> packed;
  BYTE found_banks [256];
  BYTE found_instruments [256];
  TArray<unsigned_short,_unsigned_short> local_258;
  MIDIStreamer *local_240;
  char local_238 [128];
  undefined1 local_1b8;
  char local_138 [264];
  
  uVar6 = 0;
  memset(local_138,0,0x100);
  memset(local_238,0,0x100);
  this->LoopLimit = 1;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  local_238[0] = '\x01';
  local_1b8 = 1;
  iVar2 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
  bVar1 = false;
  if ((char)iVar2 == '\0') {
    local_240 = (MIDIStreamer *)(this->Events + 1);
    bVar1 = false;
    do {
      iVar2 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])(this,this->Events,local_240,600000000);
      for (paDVar3 = this->Events; paDVar3 < (undefined1 *)CONCAT44(extraout_var,iVar2);
          paDVar3 = (DWORD (*) [384])((long)*paDVar3 + lVar8)) {
        uVar11 = (*paDVar3)[2];
        if (uVar11 < 0x1000000) {
          uVar4 = uVar11 >> 8 & 0x7f;
          pcVar7 = local_138;
          if ((uVar11 & 0xf) == 9 || (uVar11 & 0x70) != 0x40) {
            if (uVar4 == 0 || (uVar11 & 0x7f) != 0x49) {
              uVar10 = uVar11 >> 0x10 & 0x7f;
              if (uVar10 != 0 && (uVar11 & 0x7f) == 0x19) {
                uVar4 = uVar4 | 0x80;
                goto LAB_0033e9e1;
              }
              if (((uVar10 == 0) || ((uVar11 & 0x70) != 0x30)) || (uVar4 != 0)) goto LAB_0033e9e7;
              uVar4 = uVar10;
              if ((uVar11 & 0xf) == 9) {
                uVar4 = uVar11 >> 0x10 | 0x80;
              }
            }
            else {
              uVar4 = uVar4 | 0x80;
            }
            bVar1 = true;
            pcVar7 = local_238;
          }
LAB_0033e9e1:
          pcVar7[uVar4] = '\x01';
        }
LAB_0033e9e7:
        lVar8 = (ulong)(((*paDVar3)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
        if (-1 < (int)(*paDVar3)[2]) {
          lVar8 = 0xc;
        }
      }
      iVar2 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
    } while ((char)iVar2 == '\0');
  }
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  local_258.Array = (unsigned_short *)0x0;
  local_258.Most = 0;
  local_258.Count = 0;
  uVar5 = 0;
  puVar9 = (unsigned_short *)0x0;
  uVar12 = 0;
  local_240 = this;
  do {
    if (local_138[uVar12] != '\0') {
      if (bVar1) {
        uVar11 = (uint)uVar12 & 0x7f | uVar6 & 0xffffc000;
        lVar8 = 0;
        do {
          if (local_238[lVar8 + (uVar12 & 0xffffffffffffff80)] != '\0') {
            TArray<unsigned_short,_unsigned_short>::Grow(&local_258,1);
            local_258.Array[local_258.Count] = (unsigned_short)uVar11;
            uVar5 = (ulong)(local_258.Count + 1);
            local_258.Count = local_258.Count + 1;
            puVar9 = local_258.Array;
          }
          lVar8 = lVar8 + 1;
          uVar11 = uVar11 + 0x80;
        } while (lVar8 != 0x80);
      }
      else {
        TArray<unsigned_short,_unsigned_short>::Grow(&local_258,1);
        local_258.Array[local_258.Count] =
             (ushort)(((uint)uVar12 & 0x80) << 7) | (ushort)uVar12 & 0x7f;
        uVar5 = (ulong)(local_258.Count + 1);
        local_258.Count = local_258.Count + 1;
        puVar9 = local_258.Array;
      }
    }
    uVar12 = uVar12 + 1;
    uVar6 = uVar6 + 0x80;
  } while (uVar12 != 0x100);
  (*local_240->MIDI->_vptr_MIDIDevice[0x11])(local_240->MIDI,puVar9,uVar5);
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_258);
  return;
}

Assistant:

void MIDIStreamer::Precache()
{
	BYTE found_instruments[256] = { 0, };
	BYTE found_banks[256] = { 0, };
	bool multiple_banks = false;

	LoopLimit = 1;
	DoRestart();
	found_banks[0] = true;		// Bank 0 is always used.
	found_banks[128] = true;

	// Simulate playback to pick out used instruments.
	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				int command = (event[2] & 0x70);
				int channel = (event[2] & 0x0f);
				int data1 = (event[2] >> 8) & 0x7f;
				int data2 = (event[2] >> 16) & 0x7f;

				if (channel != 9 && command == (MIDI_PRGMCHANGE & 0x70))
				{
					found_instruments[data1] = true;
				}
				else if (channel == 9 && command == (MIDI_PRGMCHANGE & 0x70) && data1 != 0)
				{ // On a percussion channel, program change also serves as bank select.
					multiple_banks = true;
					found_banks[data1 | 128] = true;
				}
				else if (channel == 9 && command == (MIDI_NOTEON & 0x70) && data2 != 0)
				{
					found_instruments[data1 | 128] = true;
				}
				else if (command == (MIDI_CTRLCHANGE & 0x70) && data1 == 0 && data2 != 0)
				{
					multiple_banks = true;
					if (channel == 9)
					{
						found_banks[data2 | 128] = true;
					}
					else
					{
						found_banks[data2] = true;
					}
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}
	DoRestart();

	// Now pack everything into a contiguous region for the PrecacheInstruments call().
	TArray<WORD> packed;

	for (int i = 0; i < 256; ++i)
	{
		if (found_instruments[i])
		{
			WORD packnum = (i & 127) | ((i & 128) << 7);
			if (!multiple_banks)
			{
				packed.Push(packnum);
			}
			else
			{ // In order to avoid having to multiplex tracks in a type 1 file,
			  // precache every used instrument in every used bank, even if not
			  // all combinations are actually used.
				for (int j = 0; j < 128; ++j)
				{
					if (found_banks[j + (i & 128)])
					{
						packed.Push(packnum | (j << 7));
					}
				}
			}
		}
	}
	MIDI->PrecacheInstruments(&packed[0], packed.Size());
}